

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

string * __thiscall
duckdb::UpdateInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,UpdateInfo *this)

{
  UpdateInfo *this_00;
  ulong index;
  string *result;
  UndoBufferReference next_pin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Value local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  LogicalType::ToString_abi_cxx11_(&local_50,&this->segment->column_data->type);
  ::std::operator+(&local_b0,"Update Info [",&local_50);
  ::std::operator+(&local_110,&local_b0,", Count: ");
  std::__cxx11::to_string(&local_70,this->N);
  ::std::operator+(&local_150,&local_110,&local_70);
  ::std::operator+(&local_130,&local_150,", Transaction Id: ");
  ::std::__cxx11::to_string
            (&local_90,(this->version_number).super___atomic_base<unsigned_long>._M_i);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   &local_130,&local_90);
  ::std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                   "]\n");
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_50);
  for (index = 0; index < this->N; index = index + 1) {
    std::__cxx11::to_string(&local_b0,*(uint *)((long)&this[1].segment + index * 4));
    ::std::operator+(&local_110,&local_b0,": ");
    GetValue(&local_f0,this,index);
    Value::ToString_abi_cxx11_(&local_50,&local_f0);
    ::std::operator+(&local_150,&local_110,&local_50);
    ::std::operator+(&local_130,&local_150,anon_var_dwarf_4b71d2e + 8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_50);
    Value::~Value(&local_f0);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((this->next).entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin((UndoBufferReference *)&local_f0,&this->next);
    this_00 = (UpdateInfo *)UndoBufferReference::Ptr((UndoBufferReference *)&local_f0);
    ToString_abi_cxx11_(&local_150,this_00);
    ::std::operator+(&local_130,"\nChild Segment: ",&local_150);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
    BufferHandle::~BufferHandle((BufferHandle *)&local_f0.type_.type_info_);
  }
  return __return_storage_ptr__;
}

Assistant:

string UpdateInfo::ToString() {
	auto &type = segment->column_data.type;
	string result = "Update Info [" + type.ToString() + ", Count: " + to_string(N) +
	                ", Transaction Id: " + to_string(version_number) + "]\n";
	auto tuples = GetTuples();
	for (idx_t i = 0; i < N; i++) {
		result += to_string(tuples[i]) + ": " + GetValue(i).ToString() + "\n";
	}
	if (HasNext()) {
		auto next_pin = next.Pin();
		result += "\nChild Segment: " + Get(next_pin).ToString();
	}
	return result;
}